

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qundogroup.cpp
# Opt level: O0

void QUndoGroup::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  QString *_t1;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  QUndoGroup *_t;
  QUndoGroup *in_stack_ffffffffffffff70;
  QUndoGroup *in_stack_ffffffffffffff78;
  
  if (in_ESI == 0) {
    _t1 = (QString *)(ulong)in_EDX;
    switch(_t1) {
    case (QString *)0x0:
      activeStackChanged((QUndoGroup *)0xa89c37,(QUndoStack *)_t1);
      break;
    case (QString *)0x1:
      indexChanged((QUndoGroup *)0xa89c54,0);
      break;
    case (QString *)0x2:
      cleanChanged((QUndoGroup *)0xa89c76,false);
      break;
    case (QString *)0x3:
      canUndoChanged((QUndoGroup *)0xa89c98,false);
      break;
    case (QString *)0x4:
      canRedoChanged((QUndoGroup *)0xa89cba,false);
      break;
    case (QString *)0x5:
      undoTextChanged(in_stack_ffffffffffffff70,_t1);
      break;
    case (QString *)0x6:
      redoTextChanged(in_stack_ffffffffffffff70,_t1);
      break;
    case (QString *)0x7:
      undo(in_stack_ffffffffffffff70);
      break;
    case (QString *)0x8:
      redo(in_stack_ffffffffffffff70);
      break;
    case (QString *)0x9:
      setActiveStack(in_stack_ffffffffffffff78,(QUndoStack *)in_stack_ffffffffffffff70);
    }
  }
  if ((((in_ESI == 5) &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QUndoStack*)>
                          (in_RCX,(void **)activeStackChanged,0,0), !bVar1)) &&
      (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(int)>
                         (in_RCX,(void **)indexChanged,0,1), !bVar1)) &&
     (((bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                          (in_RCX,(void **)cleanChanged,0,2), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                          (in_RCX,(void **)canUndoChanged,0,3), !bVar1)) &&
      ((bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(bool)>
                          (in_RCX,(void **)canRedoChanged,0,4), !bVar1 &&
       (bVar1 = QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QString_const&)>
                          (in_RCX,(void **)undoTextChanged,0,5), !bVar1)))))) {
    QtMocHelpers::indexOfMethod<void(QUndoGroup::*)(QString_const&)>
              (in_RCX,(void **)redoTextChanged,0,6);
  }
  return;
}

Assistant:

void QUndoGroup::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QUndoGroup *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->activeStackChanged((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        case 1: _t->indexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->cleanChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 3: _t->canUndoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 4: _t->canRedoChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        case 5: _t->undoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 6: _t->redoTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 7: _t->undo(); break;
        case 8: _t->redo(); break;
        case 9: _t->setActiveStack((*reinterpret_cast< std::add_pointer_t<QUndoStack*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(QUndoStack * )>(_a, &QUndoGroup::activeStackChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(int )>(_a, &QUndoGroup::indexChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::cleanChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canUndoChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(bool )>(_a, &QUndoGroup::canRedoChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::undoTextChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QUndoGroup::*)(const QString & )>(_a, &QUndoGroup::redoTextChanged, 6))
            return;
    }
}